

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::copyInto
          (ControlPacketSerializableImpl *this,uint8 *buffer)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  *buffer = this->header->typeAndFlags;
  memcpy(buffer + 1,&(this->remLength).field_0,(ulong)(this->remLength).size);
  uVar1 = (this->remLength).size;
  iVar2 = (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[1])
                    (this->fixedVariableHeader,buffer + (ulong)uVar1 + 1);
  uVar3 = iVar2 + uVar1 + 1;
  iVar2 = (*(this->props->super_Serializable)._vptr_Serializable[1])(this->props,buffer + uVar3);
  uVar3 = iVar2 + uVar3;
  iVar2 = (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[1])
                    (this->payload,buffer + uVar3);
  return iVar2 + uVar3;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = 1; buffer[0] = header.typeAndFlags;
                    o += remLength.copyInto(buffer+o);
                    o += fixedVariableHeader.copyInto(buffer+o);
                    o += props.copyInto(buffer+o);
                    o += payload.copyInto(buffer+o);
                    return o;
                }